

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_modpow(mp_int *base,mp_int *exponent,mp_int *modulus)

{
  MontyContext *mc;
  mp_int *base_00;
  mp_int *x;
  mp_int *r;
  
  if (modulus->nw == 0) {
    __assert_fail("modulus->nw > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x67e,"mp_int *mp_modpow(mp_int *, mp_int *, mp_int *)");
  }
  if ((*modulus->w & 1) != 0) {
    mc = monty_new(modulus);
    base_00 = mp_modmul(base,mc->powers_of_r_mod_m[0],mc->m);
    x = monty_pow(mc,base_00,exponent);
    r = mp_make_sized(mc->rw);
    monty_export_into(mc,r,x);
    mp_free(base_00);
    mp_free(x);
    monty_free(mc);
    return r;
  }
  __assert_fail("modulus->w[0] & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x67f,"mp_int *mp_modpow(mp_int *, mp_int *, mp_int *)");
}

Assistant:

mp_int *mp_modpow(mp_int *base, mp_int *exponent, mp_int *modulus)
{
    assert(modulus->nw > 0);
    assert(modulus->w[0] & 1);

    MontyContext *mc = monty_new(modulus);
    mp_int *m_base = monty_import(mc, base);
    mp_int *m_out = monty_pow(mc, m_base, exponent);
    mp_int *out = monty_export(mc, m_out);
    mp_free(m_base);
    mp_free(m_out);
    monty_free(mc);
    return out;
}